

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

StackSym * StackSym::NewArgSlotSym(ArgSlot argSlotNum,Func *func,IRType type)

{
  StackSym *pSVar1;
  StackSym *stackSym;
  IRType type_local;
  Func *func_local;
  ArgSlot argSlotNum_local;
  
  pSVar1 = New(type,func);
  *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xffefffff | 0x100000;
  *(ArgSlot *)&(pSVar1->super_Sym).field_0x16 = argSlotNum;
  pSVar1->m_argPosition = 0;
  return pSVar1;
}

Assistant:

StackSym *
StackSym::NewArgSlotSym(Js::ArgSlot argSlotNum, Func * func, IRType type /* = TyVar */)
{
    StackSym * stackSym = StackSym::New(type, func);
    stackSym->m_isArgSlotSym = true;
    stackSym->m_slotNum = argSlotNum;

#if defined(_M_X64)
    stackSym->m_argPosition = 0;
#endif

    return stackSym;
}